

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::SetConNames
          (BasicProblem<mp::BasicProblemParams<int>_> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->con_names_);
  return;
}

Assistant:

void SetConNames(std::vector<std::string> names) {
    assert((size_t)num_cons() == names.size());
    con_names_ = std::move( names );
  }